

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O2

size_t __thiscall
edition_unittest::TestChildExtensionData::ByteSizeLong(TestChildExtensionData *this)

{
  long lVar1;
  int iVar2;
  anon_union_32_1_493b367e_for_TestChildExtensionData_3 aVar3;
  size_t sVar4;
  uint uVar5;
  size_t sVar6;
  
  aVar3 = this->field_0;
  if (((undefined1  [32])aVar3 & (undefined1  [32])0x7) == (undefined1  [32])0x0) {
    sVar6 = 0;
  }
  else {
    if (((undefined1  [32])aVar3 & (undefined1  [32])0x1) == (undefined1  [32])0x0) {
      sVar6 = 0;
    }
    else {
      lVar1 = *(long *)(((ulong)(this->field_0)._impl_.a_.tagged_ptr_.ptr_ & 0xfffffffffffffffc) + 8
                       );
      uVar5 = (uint)lVar1 | 1;
      iVar2 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar6 = lVar1 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
    }
    if (((undefined1  [32])aVar3 & (undefined1  [32])0x2) != (undefined1  [32])0x0) {
      lVar1 = *(long *)(((ulong)(this->field_0)._impl_.b_.tagged_ptr_.ptr_ & 0xfffffffffffffffc) + 8
                       );
      uVar5 = (uint)lVar1 | 1;
      iVar2 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar6 = sVar6 + lVar1 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
    }
    if (((undefined1  [32])aVar3 & (undefined1  [32])0x4) != (undefined1  [32])0x0) {
      sVar4 = google::protobuf::internal::WireFormatLite::
              MessageSize<edition_unittest::TestChildExtensionData_NestedTestAllExtensionsData>
                        ((this->field_0)._impl_.optional_extension_);
      sVar6 = sVar6 + sVar4 + 1;
    }
  }
  sVar6 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar6,&(this->field_0)._impl_._cached_size_);
  return sVar6;
}

Assistant:

::size_t TestChildExtensionData::ByteSizeLong() const {
  const TestChildExtensionData& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:edition_unittest.TestChildExtensionData)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    // string a = 1;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_a());
    }
    // string b = 2;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_b());
    }
    // .edition_unittest.TestChildExtensionData.NestedTestAllExtensionsData optional_extension = 3;
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.optional_extension_);
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}